

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::unregister(CommonCore *this)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __sv_type _Var3;
  shared_ptr<helics::Core> keepCoreAlive2;
  shared_ptr<helics::Core> keepCoreAlive;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_58;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  string_view in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  name._M_str = in_stack_ffffffffffffffc8;
  name._M_len = in_stack_ffffffffffffffc0;
  CoreFactory::findCore(name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe8);
  if ((bVar1) &&
     (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
                          &stack0xffffffffffffffe8), pbVar2 == in_RDI)) {
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    in_stack_ffffffffffffffc8 = (char *)_Var3._M_len;
    CoreFactory::unregisterCore(in_stack_ffffffffffffffe8);
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5325cc);
  if (!bVar1) {
    std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    name_00._M_str = in_stack_ffffffffffffffc8;
    name_00._M_len = in_stack_ffffffffffffffc0;
    CoreFactory::findCore(name_00);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_58);
    if ((bVar1) &&
       (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(&local_58),
       pbVar2 == in_RDI)) {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
      CoreFactory::unregisterCore(in_stack_ffffffffffffffe8);
    }
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x53267d);
  }
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x532687);
  return;
}

Assistant:

void CommonCore::unregister()
{
    /*We need to ensure that the destructor is not called immediately upon calling unregister
    otherwise this would be a mess and probably cause segmentation faults so we capture it in a
    local variable that will be destroyed on function exit
    */
    auto keepCoreAlive = CoreFactory::findCore(identifier);
    if (keepCoreAlive) {
        if (keepCoreAlive.get() == this) {
            CoreFactory::unregisterCore(identifier);
        }
    }

    if (!prevIdentifier.empty()) {
        auto keepCoreAlive2 = CoreFactory::findCore(prevIdentifier);
        if (keepCoreAlive2) {
            if (keepCoreAlive2.get() == this) {
                CoreFactory::unregisterCore(prevIdentifier);
            }
        }
    }
}